

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void change_special_filename(bool filename_is_code,string *filename)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  byte in_DIL;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_DIL & 1) == 0) {
    bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)in_RSI,"<stdin>");
    }
  }
  else {
    std::__cxx11::string::operator=((string *)in_RSI,"<cmdline>");
  }
  return;
}

Assistant:

void change_special_filename(bool filename_is_code, std::string *filename)
{
    if (filename_is_code) {
        *filename = "<cmdline>";
    } else if (*filename == "-") {
        *filename = "<stdin>";
    }
}